

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Denamespace(string *__return_storage_ptr__,Namer *this,string *s,char delimiter)

{
  string local_48 [8];
  string prefix;
  char delimiter_local;
  string *s_local;
  Namer *this_local;
  
  prefix.field_2._M_local_buf[0xf] = delimiter;
  std::__cxx11::string::string(local_48);
  (*this->_vptr_Namer[0x15])
            (__return_storage_ptr__,this,s,local_48,
             (ulong)(uint)(int)prefix.field_2._M_local_buf[0xf]);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Denamespace(const std::string &s,
                                  const char delimiter = '.') const {
    std::string prefix;
    return Denamespace(s, prefix, delimiter);
  }